

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O0

Vector<double,_6U> * __thiscall
OpenMD::Vector<double,_6U>::operator=(Vector<double,_6U> *this,Vector<double,_6U> *v)

{
  double *pdVar1;
  Vector<double,_6U> *in_RSI;
  Vector<double,_6U> *in_RDI;
  uint i;
  uint local_1c;
  
  if (in_RDI != in_RSI) {
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      pdVar1 = operator[](in_RSI,local_1c);
      in_RDI->data_[local_1c] = *pdVar1;
    }
  }
  return in_RDI;
}

Assistant:

inline Vector<Real, Dim>& operator=(const Vector<Real, Dim>& v) {
      if (this == &v) return *this;

      for (unsigned int i = 0; i < Dim; i++)
        this->data_[i] = v[i];

      return *this;
    }